

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O2

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessAtomics
          (ConversionStream *this,iterator *ScopeStart,iterator *ScopeEnd)

{
  int iVar1;
  HLSL2GLSLConverterImpl *pHVar2;
  const_iterator __position;
  const_iterator cVar3;
  _List_node_base *p_Var4;
  HLSLObjectInfo *pHVar5;
  const_iterator cVar6;
  int iVar7;
  int iVar8;
  String *in_stack_ffffffffffffff48;
  iterator Token;
  Uint32 NumArguments;
  iterator OperationToken;
  iterator ArgsListEndToken;
  string err;
  String local_60;
  TokenListType *local_40;
  iterator *local_38;
  
  Token = (iterator)ScopeStart->_M_node;
  local_40 = &this->m_Tokens;
  local_38 = ScopeStart;
  do {
    while( true ) {
      if (Token._M_node == ScopeEnd->_M_node) {
        return;
      }
      if (*(int *)&Token._M_node[1]._M_next == 0x13b) break;
LAB_003321b2:
      Token._M_node = (Token._M_node)->_M_next;
    }
    pHVar2 = this->m_Converter;
    HashMapStringKey::HashMapStringKey
              ((HashMapStringKey *)&err,(Char *)Token._M_node[1]._M_prev,false);
    cVar3 = std::
            _Hashtable<Diligent::HashMapStringKey,_Diligent::HashMapStringKey,_std::allocator<Diligent::HashMapStringKey>,_std::__detail::_Identity,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&(pHVar2->m_AtomicOperations)._M_h,(key_type *)&err);
    HashMapStringKey::Clear((HashMapStringKey *)&err);
    if (cVar3.super__Node_iterator_base<Diligent::HashMapStringKey,_false>._M_cur ==
        (__node_type *)0x0) goto LAB_003321b2;
    OperationToken = Token;
    Token._M_node = (Token._M_node)->_M_next;
    if (Token._M_node == ScopeEnd->_M_node) {
      FormatString<char[15]>(&err,(char (*) [15])"Unexpected EOF");
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_60,this,&Token,4);
      in_stack_ffffffffffffff48 = &local_60;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessAtomics",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x8c4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&err,
                 (char (*) [2])0x70fe85,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&err);
    }
    if (*(int *)&Token._M_node[1]._M_next != 0x135) {
      FormatString<char[25]>(&err,(char (*) [25])"Open bracket is expected");
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_60,this,&Token,4);
      in_stack_ffffffffffffff48 = &local_60;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessAtomics",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x8c5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&err,
                 (char (*) [2])0x70fe85,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&err);
    }
    ArgsListEndToken._M_node = Token._M_node;
    NumArguments = CountFunctionArguments(this,&ArgsListEndToken,ScopeEnd);
    p_Var4 = ScopeEnd->_M_node;
    if (ArgsListEndToken._M_node == p_Var4) {
      FormatString<char[15]>(&err,(char (*) [15])"Unexpected EOF");
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_60,this,&ArgsListEndToken,4);
      in_stack_ffffffffffffff48 = &local_60;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessAtomics",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x8cc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&err,
                 (char (*) [2])0x70fe85,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&err);
      p_Var4 = ScopeEnd->_M_node;
    }
    Token._M_node = (Token._M_node)->_M_next;
    if (Token._M_node == p_Var4) {
      FormatString<char[15]>(&err,(char (*) [15])"Unexpected EOF");
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_60,this,&Token,4);
      in_stack_ffffffffffffff48 = &local_60;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessAtomics",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x8cf,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&err,
                 (char (*) [2])0x70fe85,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&err);
    }
    pHVar5 = FindHLSLObject(this,(String *)&Token._M_node[1]._M_prev);
    pHVar2 = this->m_Converter;
    if (pHVar5 == (HLSLObjectInfo *)0x0) {
      FunctionStubHashKey::FunctionStubHashKey
                ((FunctionStubHashKey *)&err,"shared_var",(Char *)OperationToken._M_node[1]._M_prev,
                 NumArguments);
      cVar6 = std::
              _Hashtable<Diligent::FunctionStubHashKey,_std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_std::allocator<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::FunctionStubHashKey>,_Diligent::FunctionStubHashKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<Diligent::FunctionStubHashKey,_std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_std::allocator<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::FunctionStubHashKey>,_Diligent::FunctionStubHashKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)pHVar2,(FunctionStubHashKey *)&err);
      FunctionStubHashKey::~FunctionStubHashKey((FunctionStubHashKey *)&err);
      if (cVar6.
          super__Node_iterator_base<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false>
          ._M_cur == (__node_type *)0x0) {
        FormatString<char[43],std::__cxx11::string,char[7],unsigned_int,char[11]>
                  (&err,(Diligent *)"Unable to find function stub for function ",
                   (char (*) [43])&OperationToken._M_node[1]._M_prev,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7d6af1,
                   (char (*) [7])&NumArguments,(uint *)0x734c1f,
                   (char (*) [11])in_stack_ffffffffffffff48);
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  (&local_60,this,&OperationToken,4);
        in_stack_ffffffffffffff48 = &local_60;
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ProcessAtomics",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x909,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&err,
                   (char (*) [2])0x70fe85,&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)&err);
      }
    }
    else {
      FunctionStubHashKey::FunctionStubHashKey
                ((FunctionStubHashKey *)&err,"image",(Char *)OperationToken._M_node[1]._M_prev,
                 NumArguments);
      cVar6 = std::
              _Hashtable<Diligent::FunctionStubHashKey,_std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_std::allocator<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::FunctionStubHashKey>,_Diligent::FunctionStubHashKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<Diligent::FunctionStubHashKey,_std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_std::allocator<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::FunctionStubHashKey>,_Diligent::FunctionStubHashKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)pHVar2,(FunctionStubHashKey *)&err);
      FunctionStubHashKey::~FunctionStubHashKey((FunctionStubHashKey *)&err);
      if (cVar6.
          super__Node_iterator_base<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false>
          ._M_cur == (__node_type *)0x0) {
        FormatString<char[43],std::__cxx11::string,char[7],unsigned_int,char[11]>
                  (&err,(Diligent *)"Unable to find function stub for function ",
                   (char (*) [43])&OperationToken._M_node[1]._M_prev,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7d6af1,
                   (char (*) [7])&NumArguments,(uint *)0x734c1f,
                   (char (*) [11])in_stack_ffffffffffffff48);
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  (&local_60,this,&OperationToken,4);
        in_stack_ffffffffffffff48 = &local_60;
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ProcessAtomics",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x8d7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&err,
                   (char (*) [2])0x70fe85,&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)&err);
      }
      for (iVar7 = 1; (Token._M_node != ScopeEnd->_M_node && (iVar7 != 0)); iVar7 = iVar7 + iVar8) {
        iVar1 = *(int *)&Token._M_node[1]._M_next;
        if ((iVar7 == 1) && ((iVar1 == 0x136 || (iVar1 == 0x13f)))) goto LAB_003322d9;
        iVar8 = -(uint)(iVar1 == 0x136);
        if (iVar1 == 0x135) {
          iVar8 = 1;
        }
        Token._M_node = (Token._M_node)->_M_next;
      }
      if (Token._M_node == ScopeEnd->_M_node) {
        FormatString<char[15]>(&err,(char (*) [15])"Unexpected EOF");
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  (&local_60,this,&Token,4);
        in_stack_ffffffffffffff48 = &local_60;
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ProcessAtomics",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x8ea,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&err,
                   (char (*) [2])0x70fe85,&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)&err);
      }
LAB_003322d9:
      if (*(int *)&Token._M_node[1]._M_next != 0x13f) {
        FormatString<char[18]>(&err,(char (*) [18])"Comma is expected");
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  (&local_60,this,&Token,4);
        in_stack_ffffffffffffff48 = &local_60;
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ProcessAtomics",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x8eb,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&err,
                   (char (*) [2])0x70fe85,&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)&err);
      }
      Token._M_node = (Token._M_node)->_M_prev;
      if (*(int *)&Token._M_node[1]._M_next != 0x138) {
        FormatString<char[13]>(&err,(char (*) [13])"Expected \']\'");
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  (&local_60,this,&Token,4);
        in_stack_ffffffffffffff48 = &local_60;
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ProcessAtomics",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x8f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&err,
                   (char (*) [2])0x70fe85,&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)&err);
      }
      __position._M_node = Token._M_node;
      Token._M_node = (Token._M_node)->_M_prev;
      std::__cxx11::
      list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
      erase(local_40,__position);
      for (; Token._M_node != local_38->_M_node; Token._M_node = (Token._M_node)->_M_prev) {
        if (*(int *)&Token._M_node[1]._M_next == 0x137) goto LAB_0033244d;
      }
      FormatString<char[13]>(&err,(char (*) [13])"Expected \'[\'");
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_60,this,&Token,4);
      in_stack_ffffffffffffff48 = &local_60;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessAtomics",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x8fb,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&err,
                 (char (*) [2])0x70fe85,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&err);
LAB_0033244d:
      *(undefined4 *)&Token._M_node[1]._M_next = 0x13f;
      std::__cxx11::string::assign((char *)&Token._M_node[1]._M_prev);
    }
    std::__cxx11::string::_M_assign((string *)&OperationToken._M_node[1]._M_prev);
    Token = ArgsListEndToken;
  } while( true );
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessAtomics(const TokenListType::iterator& ScopeStart,
                                                              const TokenListType::iterator& ScopeEnd)
{
    auto Token = ScopeStart;
    while (Token != ScopeEnd)
    {
        if (Token->Type == TokenType::Identifier)
        {
            auto AtomicIt = m_Converter.m_AtomicOperations.find(Token->Literal.c_str());
            if (AtomicIt == m_Converter.m_AtomicOperations.end())
            {
                ++Token;
                continue;
            }

            auto OperationToken = Token;
            // InterlockedAdd(g_i4SharedArray[GTid.x].x, 1, iOldVal);
            // ^
            ++Token;
            // InterlockedAdd(g_i4SharedArray[GTid.x].x, 1, iOldVal);
            //               ^
            VERIFY_PARSER_STATE(Token, Token != ScopeEnd, "Unexpected EOF");
            VERIFY_PARSER_STATE(Token, Token->Type == TokenType::OpenParen, "Open bracket is expected");

            auto ArgsListEndToken = Token;
            auto NumArguments     = CountFunctionArguments(ArgsListEndToken, ScopeEnd);
            // InterlockedAdd(Tex2D[GTid.xy], 1, iOldVal);
            //                                           ^
            //                                       ArgsListEndToken
            VERIFY_PARSER_STATE(ArgsListEndToken, ArgsListEndToken != ScopeEnd, "Unexpected EOF");

            ++Token;
            VERIFY_PARSER_STATE(Token, Token != ScopeEnd, "Unexpected EOF");

            const auto* pObjectInfo = FindHLSLObject(Token->Literal);
            if (pObjectInfo != nullptr)
            {
                // InterlockedAdd(Tex2D[GTid.xy], 1, iOldVal);
                //                ^
                auto StubIt = m_Converter.m_GLSLStubs.find(FunctionStubHashKey("image", OperationToken->Literal.c_str(), NumArguments));
                VERIFY_PARSER_STATE(OperationToken, StubIt != m_Converter.m_GLSLStubs.end(), "Unable to find function stub for function ", OperationToken->Literal, " with ", NumArguments, " arguments");

                // Find first comma
                int NumOpenBrackets = 1;
                while (Token != ScopeEnd && NumOpenBrackets != 0)
                {
                    // Do not count arguments of nested functions:
                    if (NumOpenBrackets == 1 && (Token->Type == TokenType::Comma || Token->Type == TokenType::ClosingParen))
                        break;

                    if (Token->Type == TokenType::OpenParen)
                        ++NumOpenBrackets;
                    else if (Token->Type == TokenType::ClosingParen)
                        --NumOpenBrackets;

                    ++Token;
                }
                // InterlockedAdd(Tex2D[GTid.xy], 1, iOldVal);
                //                              ^
                VERIFY_PARSER_STATE(Token, Token != ScopeEnd, "Unexpected EOF");
                VERIFY_PARSER_STATE(Token, Token->Type == TokenType::Comma, "Comma is expected");

                --Token;
                // InterlockedAdd(Tex2D[GTid.xy], 1, iOldVal);
                //                             ^
                VERIFY_PARSER_STATE(Token, Token->Type == TokenType::ClosingSquareBracket, "Expected \']\'");
                auto ClosingBracketToken = Token;
                --Token;
                m_Tokens.erase(ClosingBracketToken);
                // InterlockedAdd(Tex2D[GTid.xy, 1, iOldVal);
                //                           ^
                while (Token != ScopeStart && Token->Type != TokenType::OpenSquareBracket)
                    --Token;
                // InterlockedAdd(Tex2D[GTid.xy, 1, iOldVal);
                //                     ^

                VERIFY_PARSER_STATE(Token, Token != ScopeStart, "Expected \'[\'");
                Token->Type    = TokenType::Comma;
                Token->Literal = ",";
                // InterlockedAdd(Tex2D,GTid.xy, 1, iOldVal);
                //                     ^

                OperationToken->Literal = StubIt->second.Name;
                // InterlockedAddImage_3(Tex2D,GTid.xy, 1, iOldVal);
            }
            else
            {
                // InterlockedAdd(g_i4SharedArray[GTid.x].x, 1, iOldVal);
                //                ^
                auto StubIt = m_Converter.m_GLSLStubs.find(FunctionStubHashKey("shared_var", OperationToken->Literal.c_str(), NumArguments));
                VERIFY_PARSER_STATE(OperationToken, StubIt != m_Converter.m_GLSLStubs.end(), "Unable to find function stub for function ", OperationToken->Literal, " with ", NumArguments, " arguments");
                OperationToken->Literal = StubIt->second.Name;
                // InterlockedAddSharedVar_3(g_i4SharedArray[GTid.x].x, 1, iOldVal);
            }
            Token = ArgsListEndToken;
        }
        else
            ++Token;
    }
}